

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

LoopShape * __thiscall CFG::Relooper::AddLoopShape(Relooper *this)

{
  int iVar1;
  _Head_base<0UL,_CFG::Shape_*,_false> _Var2;
  __uniq_ptr_impl<CFG::Shape,_std::default_delete<CFG::Shape>_> local_20;
  
  _Var2._M_head_impl = (Shape *)operator_new(0x80);
  (_Var2._M_head_impl)->Id = -1;
  (_Var2._M_head_impl)->Next = (Shape *)0x0;
  (_Var2._M_head_impl)->Type = Loop;
  ((Shape *)&(_Var2._M_head_impl)->_vptr_Shape)->_vptr_Shape =
       (_func_int **)&PTR__LoopShape_00d8c3e0;
  _Var2._M_head_impl[1]._vptr_Shape = (_func_int **)0x0;
  (((BlockSet *)&_Var2._M_head_impl[1].Id)->Map)._M_h._M_buckets =
       (__buckets_ptr)&_Var2._M_head_impl[2].Next;
  _Var2._M_head_impl[1].Next = (Shape *)0x1;
  ((__node_base *)&_Var2._M_head_impl[1].Natural)->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)&_Var2._M_head_impl[1].Type = 0;
  *(float *)&_Var2._M_head_impl[2]._vptr_Shape = 1.0;
  *(size_t *)&_Var2._M_head_impl[2].Id = 0;
  _Var2._M_head_impl[2].Next = (Shape *)0x0;
  *(Shape ***)&_Var2._M_head_impl[2].Type = &_Var2._M_head_impl[2].Natural;
  _Var2._M_head_impl[2].Natural = (Shape *)&_Var2._M_head_impl[2].Natural;
  _Var2._M_head_impl[3]._vptr_Shape = (_func_int **)0x0;
  iVar1 = this->ShapeIdCounter;
  this->ShapeIdCounter = iVar1 + 1;
  (_Var2._M_head_impl)->Id = iVar1;
  local_20._M_t.super__Tuple_impl<0UL,_CFG::Shape_*,_std::default_delete<CFG::Shape>_>.
  super__Head_base<0UL,_CFG::Shape_*,_false>._M_head_impl =
       (tuple<CFG::Shape_*,_std::default_delete<CFG::Shape>_>)
       (tuple<CFG::Shape_*,_std::default_delete<CFG::Shape>_>)_Var2._M_head_impl;
  std::
  deque<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>,std::allocator<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>>>
  ::emplace_back<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>>
            ((deque<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>,std::allocator<std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>>>
              *)&this->Shapes,(unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_> *)&local_20)
  ;
  if ((_Tuple_impl<0UL,_CFG::Shape_*,_std::default_delete<CFG::Shape>_>)
      local_20._M_t.super__Tuple_impl<0UL,_CFG::Shape_*,_std::default_delete<CFG::Shape>_>.
      super__Head_base<0UL,_CFG::Shape_*,_false>._M_head_impl != (Shape *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_CFG::Shape_*,_std::default_delete<CFG::Shape>_>.
                          super__Head_base<0UL,_CFG::Shape_*,_false>._M_head_impl + 8))();
  }
  return (LoopShape *)(_Head_base<0UL,_CFG::Shape_*,_false>)_Var2._M_head_impl;
}

Assistant:

LoopShape* Relooper::AddLoopShape() {
  auto shape = std::make_unique<LoopShape>();
  shape->Id = ShapeIdCounter++;
  auto* shapePtr = shape.get();
  Shapes.push_back(std::move(shape));
  return shapePtr;
}